

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall TempDir::TempDir(TempDir *this,path *pt)

{
  path *pt_local;
  TempDir *this_local;
  
  this->_vptr_TempDir = (_func_int **)&PTR__TempDir_0013a8d0;
  boost::filesystem::path::path(&this->p,pt);
  boost::filesystem::create_directory(&this->p);
  return;
}

Assistant:

TempDir(path pt) : p(pt) {
    create_directory(p);
  }